

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::StartMouseMovingWindowOrNode
               (ImGuiWindow *window,ImGuiDockNode *node,bool undock_floating_node)

{
  ImVec2 IVar1;
  ImGuiWindow *node_00;
  bool bVar2;
  ImGuiContext *ctx;
  bool bVar3;
  ImGuiDockNode *pIVar4;
  ImVec2 IVar5;
  
  ctx = GImGui;
  bVar2 = true;
  if (((((node != (ImGuiDockNode *)0x0) &&
        (node_00 = node->VisibleWindow, node_00 != (ImGuiWindow *)0x0)) &&
       ((node_00->Flags & 4) == 0)) &&
      ((pIVar4 = DockNodeGetRootNode((ImGuiDockNode *)node_00), pIVar4->OnlyNodeWithWindows != node
       || (pIVar4->CentralNode != (ImGuiDockNode *)0x0)))) &&
     ((undock_floating_node || ((pIVar4->LocalFlags & 0x400) != 0)))) {
    bVar2 = false;
  }
  bVar3 = IsMouseDragging(0,(ctx->IO).MouseDragThreshold * 1.7);
  if ((bVar2) || (!bVar3)) {
    if (!(bool)(bVar2 & (bVar3 || (GImGui->IO).MouseDownDuration[0] == 0.0))) {
      return;
    }
    if (ctx->MovingWindow == window) {
      return;
    }
    StartMouseMovingWindow(window);
    node = (ImGuiDockNode *)window->RootWindow;
  }
  else {
    DockContextQueueUndockNode(ctx,node);
  }
  IVar1 = (ctx->IO).MouseClickedPos[0];
  IVar5.x = IVar1.x - (((ImGuiWindow *)node)->Pos).x;
  IVar5.y = IVar1.y - (((ImGuiWindow *)node)->Pos).y;
  ctx->ActiveIdClickOffset = IVar5;
  return;
}

Assistant:

void ImGui::StartMouseMovingWindowOrNode(ImGuiWindow* window, ImGuiDockNode* node, bool undock_floating_node)
{
    ImGuiContext& g = *GImGui;
    bool can_undock_node = false;
    if (node != NULL && node->VisibleWindow && (node->VisibleWindow->Flags & ImGuiWindowFlags_NoMove) == 0)
    {
        // Can undock if:
        // - part of a floating node hierarchy with more than one visible node (if only one is visible, we'll just move the whole hierarchy)
        // - part of a dockspace node hierarchy (trivia: undocking from a fixed/central node will create a new node and copy windows)
        ImGuiDockNode* root_node = DockNodeGetRootNode(node);
        if (root_node->OnlyNodeWithWindows != node || root_node->CentralNode != NULL)
            if (undock_floating_node || root_node->IsDockSpace())
                can_undock_node = true;
    }

    const bool clicked = IsMouseClicked(0);
    const bool dragging = IsMouseDragging(0, g.IO.MouseDragThreshold * 1.70f);
    if (can_undock_node && dragging)
    {
        DockContextQueueUndockNode(&g, node);
        g.ActiveIdClickOffset = g.IO.MouseClickedPos[0] - node->Pos;
    }
    else if (!can_undock_node && (clicked || dragging) && g.MovingWindow != window)
    {
        StartMouseMovingWindow(window);
        g.ActiveIdClickOffset = g.IO.MouseClickedPos[0] - window->RootWindow->Pos;
    }
}